

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderOperatorTests.cpp
# Opt level: O3

void deqp::gles3::Functional::eval_refract_vec4(ShaderEvalContext *c)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int i;
  long lVar3;
  float fVar4;
  float res;
  float fVar5;
  float local_48 [4];
  undefined1 local_38 [8];
  float fStack_30;
  float local_28;
  float fStack_24;
  float fStack_20;
  float fStack_1c;
  undefined1 local_18 [16];
  
  auVar1 = *(undefined1 (*) [16])c->in[0].m_data;
  unique0x10000015 = auVar1._0_4_;
  _local_38 = auVar1._4_12_;
  auVar2 = _local_38;
  local_48[0] = c->in[1].m_data[3];
  local_48[1] = c->in[1].m_data[2];
  local_48[2] = c->in[1].m_data[1];
  local_48[3] = c->in[1].m_data[0];
  local_18._0_4_ = c->in[2].m_data[1];
  fVar5 = 0.0;
  lVar3 = 0;
  do {
    fVar5 = fVar5 + local_48[lVar3] * *(float *)(local_38 + lVar3 * 4);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 4);
  fVar4 = 1.0 - (float)local_18._0_4_ * (float)local_18._0_4_ * (1.0 - fVar5 * fVar5);
  local_28 = 0.0;
  fStack_24 = 0.0;
  fStack_20 = 0.0;
  fStack_1c = 0.0;
  if (0.0 <= fVar4) {
    local_38._0_4_ = auVar1._4_4_;
    local_38._4_4_ = auVar1._8_4_;
    fStack_30 = auVar1._12_4_;
    local_28 = (float)local_18._0_4_ * (float)local_38._0_4_;
    fStack_24 = (float)local_18._0_4_ * (float)local_38._4_4_;
    fStack_20 = (float)local_18._0_4_ * fStack_30;
    fStack_1c = (float)local_18._0_4_ * auVar1._0_4_;
    if (fVar4 < 0.0) {
      local_18 = ZEXT416((uint)local_18._0_4_);
      _local_38 = auVar2;
      fVar4 = sqrtf(fVar4);
    }
    else {
      fVar4 = SQRT(fVar4);
    }
    fVar4 = (float)local_18._0_4_ * fVar5 + fVar4;
    local_28 = local_28 - fVar4 * local_48[0];
    fStack_24 = fStack_24 - fVar4 * local_48[1];
    fStack_20 = fStack_20 - fVar4 * local_48[2];
    fStack_1c = fStack_1c - fVar4 * local_48[3];
  }
  (c->color).m_data[0] = local_28;
  (c->color).m_data[1] = fStack_24;
  (c->color).m_data[2] = fStack_20;
  (c->color).m_data[3] = fStack_1c;
  return;
}

Assistant:

void eval_refract_vec4	(ShaderEvalContext& c) { c.color		= refract(c.in[0].swizzle(1, 2, 3, 0), c.in[1].swizzle(3, 2, 1, 0), c.in[2].y()); }